

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Snes_Spc.cpp
# Opt level: O3

void __thiscall Snes_Spc::timers_loaded(Snes_Spc *this)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  long lVar5;
  
  bVar1 = (this->m).smp_regs[0][1];
  piVar4 = &(this->m).timers[0].counter;
  lVar5 = 0;
  do {
    piVar4[-3] = (byte)((this->m).smp_regs[0][lVar5 + 10] - 1) + 1;
    piVar4[-1] = (uint)((bVar1 >> ((uint)lVar5 & 0x1f) & 1) != 0);
    *piVar4 = (this->m).smp_regs[1][lVar5 + 0xd] & 0xf;
    lVar5 = lVar5 + 1;
    piVar4 = piVar4 + 6;
  } while (lVar5 != 3);
  iVar2 = (this->m).tempo;
  iVar2 = iVar2 + (uint)(iVar2 == 0);
  iVar2 = ((iVar2 >> 1) + 0x1000) / iVar2;
  iVar3 = 4;
  if (4 < iVar2) {
    iVar3 = iVar2;
  }
  (this->m).timers[2].prescaler = iVar3;
  (this->m).timers[1].prescaler = iVar3 << 3;
  (this->m).timers[0].prescaler = iVar3 << 3;
  return;
}

Assistant:

void Snes_Spc::timers_loaded()
{
	int i;
	for ( i = 0; i < timer_count; i++ )
	{
		Timer* t = &m.timers [i];
		t->period  = IF_0_THEN_256( REGS [r_t0target + i] );
		t->enabled = REGS [r_control] >> i & 1;
		t->counter = REGS_IN [r_t0out + i] & 0x0F;
	}
	
	set_tempo( m.tempo );
}